

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::tuple_caster<std::pair,_long,_long>::load
          (tuple_caster<std::pair,_long,_long> *this,handle src,bool convert)

{
  bool bVar1;
  size_t sVar2;
  sequence seq;
  handle local_20;
  
  bVar1 = sequence::check_(src);
  if (bVar1) {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    local_20.m_ptr = src.m_ptr;
    sVar2 = sequence::size((sequence *)&local_20);
    if (sVar2 == 2) {
      bVar1 = tuple_caster<std::pair,long,long>::load_impl<0ul,1ul>
                        ((tuple_caster<std::pair,long,long> *)this,&local_20,convert);
    }
    else {
      bVar1 = false;
    }
    object::~object((object *)&local_20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        const auto seq = reinterpret_borrow<sequence>(src);
        if (seq.size() != size)
            return false;
        return load_impl(seq, convert, indices{});
    }